

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_mul_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_uint b)

{
  int iVar1;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi _B;
  mbedtls_mpi_uint local_20;
  mbedtls_mpi local_18;
  
  local_18.s = 1;
  local_18.n = 1;
  local_18.p = &local_20;
  local_20 = b;
  iVar1 = mbedtls_mpi_mul_mpi(X,A,&local_18);
  return iVar1;
}

Assistant:

int mbedtls_mpi_mul_int( mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_uint b )
{
    mbedtls_mpi _B;
    mbedtls_mpi_uint p[1];
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( A != NULL );

    _B.s = 1;
    _B.n = 1;
    _B.p = p;
    p[0] = b;

    return( mbedtls_mpi_mul_mpi( X, A, &_B ) );
}